

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autosolve.cpp
# Opt level: O0

int apply_moves(node *newest_node,Pyraminx *pyraminx)

{
  Corner corner;
  int layer;
  bool bVar1;
  pointer pmVar2;
  size_type sVar3;
  undefined1 local_40 [16];
  reverse_iterator it;
  vector<move_type,_std::allocator<move_type>_> move_list;
  Pyraminx *pyraminx_local;
  node *newest_node_local;
  
  get_move_list((vector<move_type,_std::allocator<move_type>_> *)&it,newest_node);
  std::vector<move_type,_std::allocator<move_type>_>::rbegin
            ((vector<move_type,_std::allocator<move_type>_> *)(local_40 + 8));
  while( true ) {
    std::vector<move_type,_std::allocator<move_type>_>::rend
              ((vector<move_type,_std::allocator<move_type>_> *)local_40);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<move_type_*,_std::vector<move_type,_std::allocator<move_type>_>_>_>
                             *)(local_40 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<move_type_*,_std::vector<move_type,_std::allocator<move_type>_>_>_>
                             *)local_40);
    if (!bVar1) break;
    pmVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<move_type_*,_std::vector<move_type,_std::allocator<move_type>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<move_type_*,_std::vector<move_type,_std::allocator<move_type>_>_>_>
                           *)(local_40 + 8));
    corner = pmVar2->ref_corner;
    pmVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<move_type_*,_std::vector<move_type,_std::allocator<move_type>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<move_type_*,_std::vector<move_type,_std::allocator<move_type>_>_>_>
                           *)(local_40 + 8));
    layer = pmVar2->layer;
    pmVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<move_type_*,_std::vector<move_type,_std::allocator<move_type>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<move_type_*,_std::vector<move_type,_std::allocator<move_type>_>_>_>
                           *)(local_40 + 8));
    Pyraminx::turn_layer(pyraminx,corner,layer,pmVar2->dir);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<move_type_*,_std::vector<move_type,_std::allocator<move_type>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<move_type_*,_std::vector<move_type,_std::allocator<move_type>_>_>_>
                  *)(local_40 + 8));
  }
  sVar3 = std::vector<move_type,_std::allocator<move_type>_>::size
                    ((vector<move_type,_std::allocator<move_type>_> *)&it);
  std::vector<move_type,_std::allocator<move_type>_>::~vector
            ((vector<move_type,_std::allocator<move_type>_> *)&it);
  return (int)sVar3;
}

Assistant:

int apply_moves(const node* newest_node, Pyraminx& pyraminx){
    std::vector<move_type> move_list = get_move_list(newest_node);
    for(auto it = move_list.rbegin(); it != move_list.rend(); ++it){
        pyraminx.turn_layer(it->ref_corner, it->layer, it->dir);
    }
    return move_list.size(); // new g value
}